

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BayesianProbitRegressor::SharedDtor(BayesianProbitRegressor *this)

{
  ulong uVar1;
  BayesianProbitRegressor_Gaussian *this_00;
  LogMessage *other;
  undefined8 *puVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 != (undefined8 *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/BayesianProbitRegressor.pb.cc"
               ,0x37e);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if ((undefined8 *)(this->regressioninputfeaturename_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath
              (&this->regressioninputfeaturename_);
  }
  if ((undefined8 *)(this->optimisminputfeaturename_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath
              (&this->optimisminputfeaturename_);
  }
  if ((undefined8 *)(this->samplingscaleinputfeaturename_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath
              (&this->samplingscaleinputfeaturename_);
  }
  if ((undefined8 *)(this->samplingtruncationinputfeaturename_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath
              (&this->samplingtruncationinputfeaturename_);
  }
  if ((undefined8 *)(this->meanoutputfeaturename_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath
              (&this->meanoutputfeaturename_);
  }
  if ((undefined8 *)(this->varianceoutputfeaturename_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath
              (&this->varianceoutputfeaturename_);
  }
  if ((undefined8 *)(this->pessimisticprobabilityoutputfeaturename_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath
              (&this->pessimisticprobabilityoutputfeaturename_);
  }
  if ((undefined8 *)(this->sampledprobabilityoutputfeaturename_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath
              (&this->sampledprobabilityoutputfeaturename_);
  }
  if ((this != (BayesianProbitRegressor *)_BayesianProbitRegressor_default_instance_) &&
     (this_00 = this->bias_, this_00 != (BayesianProbitRegressor_Gaussian *)0x0)) {
    BayesianProbitRegressor_Gaussian::~BayesianProbitRegressor_Gaussian(this_00);
    operator_delete(this_00,0x28);
  }
  return;
}

Assistant:

inline void BayesianProbitRegressor::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  regressioninputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  optimisminputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  samplingscaleinputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  samplingtruncationinputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  meanoutputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  varianceoutputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  pessimisticprobabilityoutputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  sampledprobabilityoutputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) delete bias_;
}